

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O0

void __thiscall
ScenePreprocessorTest_testMeshPreprocessingPos_Test::TestBody
          (ScenePreprocessorTest_testMeshPreprocessingPos_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  aiMesh *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  aiVector3D *paVar6;
  char *pcVar7;
  aiFace *paVar8;
  ulong uVar9;
  aiVector3t<float> *local_e8;
  aiFace *local_d0;
  AssertHelper local_a8;
  Message local_a0;
  uint local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  uint local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50 [3];
  uint local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  uint i;
  aiMesh *p;
  ScenePreprocessorTest_testMeshPreprocessingPos_Test *this_local;
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  this_00->mNumFaces = 100;
  uVar3 = CONCAT44(0,this_00->mNumFaces);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar9 = uVar4 + 8;
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar9 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar9);
  *puVar5 = uVar3;
  paVar8 = (aiFace *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_d0 = paVar8;
    do {
      aiFace::aiFace(local_d0);
      local_d0 = local_d0 + 1;
    } while (local_d0 != paVar8 + uVar3);
  }
  this_00->mFaces = paVar8;
  paVar6 = (aiVector3D *)operator_new__(0x78);
  local_e8 = paVar6;
  do {
    aiVector3t<float>::aiVector3t(local_e8);
    local_e8 = local_e8 + 1;
  } while (local_e8 != paVar6 + 10);
  this_00->mTextureCoords[0] = paVar6;
  this_00->mNumUVComponents[0] = 0;
  this_00->mNumUVComponents[1] = 0;
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,this_00,1,1);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,this_00,2,2);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,this_00,3,4);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,this_00,4,8);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,this_00,0x4e1,8);
  for (gtest_ar.message_.ptr_._4_4_ = 0; gtest_ar.message_.ptr_._4_4_ < this_00->mNumFaces >> 1;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    this_00->mFaces[gtest_ar.message_.ptr_._4_4_].mNumIndices = 3;
  }
  for (; gtest_ar.message_.ptr_._4_4_ < this_00->mNumFaces - (this_00->mNumFaces >> 2);
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    this_00->mFaces[gtest_ar.message_.ptr_._4_4_].mNumIndices = 4;
  }
  for (; gtest_ar.message_.ptr_._4_4_ < this_00->mNumFaces;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    this_00->mFaces[gtest_ar.message_.ptr_._4_4_].mNumIndices = 10;
  }
  ScenePreprocessorTest::ProcessMesh(&this->super_ScenePreprocessorTest,this_00);
  local_34 = 0xc;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_30,
             "static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON)",
             "p->mPrimitiveTypes",&local_34,(uint *)this_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(local_50);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_6c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_68,"2U","p->mNumUVComponents[0]",&local_6c,
             this_00->mNumUVComponents);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_78);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_94 = 0;
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_int>
            ((char *)local_90,"0U",(uint *)"p->mNumUVComponents[1]",&local_94,
             this_00->mNumUVComponents + 1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar2) {
    testing::Message::Message(&local_a0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (this_00 != (aiMesh *)0x0) {
    aiMesh::~aiMesh(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testMeshPreprocessingPos) {
    aiMesh* p = new aiMesh;
    p->mNumFaces = 100;
    p->mFaces = new aiFace[p->mNumFaces];

    p->mTextureCoords[0] = new aiVector3D[10];
    p->mNumUVComponents[0] = 0;
    p->mNumUVComponents[1] = 0;

    CheckIfOnly(p,1,aiPrimitiveType_POINT);
    CheckIfOnly(p,2,aiPrimitiveType_LINE);
    CheckIfOnly(p,3,aiPrimitiveType_TRIANGLE);
    CheckIfOnly(p,4,aiPrimitiveType_POLYGON);
    CheckIfOnly(p,1249,aiPrimitiveType_POLYGON);

    // Polygons and triangles mixed
    unsigned i;
    for (i = 0; i < p->mNumFaces/2;++i) {
        p->mFaces[i].mNumIndices = 3;
    }
    for (; i < p->mNumFaces-p->mNumFaces/4;++i) {
        p->mFaces[i].mNumIndices = 4;
    }
    for (; i < p->mNumFaces;++i)    {
        p->mFaces[i].mNumIndices = 10;
    }
    ProcessMesh(p);
    EXPECT_EQ(static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON),
              p->mPrimitiveTypes);
    EXPECT_EQ(2U, p->mNumUVComponents[0]);
    EXPECT_EQ(0U, p->mNumUVComponents[1]);
    delete p;
}